

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  void *pvVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  
  CVar3 = CURLE_OK;
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    CVar2 = cf_hc_baller_cntrl((cf_hc_baller *)((long)pvVar1 + 0x28),data,event,arg1,arg2);
    if ((CVar2 == CURLE_AGAIN) || (CVar2 == CURLE_OK)) {
      CVar2 = cf_hc_baller_cntrl((cf_hc_baller *)((long)pvVar1 + 0x58),data,event,arg1,arg2);
    }
    CVar3 = CURLE_OK;
    if (CVar2 != CURLE_AGAIN) {
      CVar3 = CVar2;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode cf_hc_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(!cf->connected) {
    result = cf_hc_baller_cntrl(&ctx->h3_baller, data, event, arg1, arg2);
    if(!result || (result == CURLE_AGAIN))
      result = cf_hc_baller_cntrl(&ctx->h21_baller, data, event, arg1, arg2);
    if(result == CURLE_AGAIN)
      result = CURLE_OK;
  }
  return result;
}